

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeSetSpacePreserve(xmlNodePtr cur,int val)

{
  xmlAttrPtr pxVar1;
  char *pcStack_38;
  int res;
  char *string;
  xmlAttrPtr attr;
  xmlNsPtr ns;
  xmlNodePtr pxStack_18;
  int val_local;
  xmlNodePtr cur_local;
  
  if ((cur == (xmlNodePtr)0x0) || (cur->type != XML_ELEMENT_NODE)) {
    cur_local._4_4_ = 1;
  }
  else {
    ns._4_4_ = val;
    pxStack_18 = cur;
    cur_local._4_4_ =
         xmlSearchNsByHrefSafe
                   (cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",(xmlNsPtr *)&attr);
    if (cur_local._4_4_ == 0) {
      if (ns._4_4_ == 0) {
        pcStack_38 = "default";
      }
      else {
        pcStack_38 = "preserve";
      }
      pxVar1 = xmlSetNsProp(pxStack_18,(xmlNsPtr)attr,"space",(xmlChar *)pcStack_38);
      if (pxVar1 == (xmlAttrPtr)0x0) {
        cur_local._4_4_ = -1;
      }
      else {
        cur_local._4_4_ = 0;
      }
    }
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlNodeSetSpacePreserve(xmlNodePtr cur, int val) {
    xmlNsPtr ns;
    xmlAttrPtr attr;
    const char *string;
    int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(1);

    res = xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (res != 0)
	return(res);

    if (val == 0)
        string = "default";
    else
        string = "preserve";

    attr = xmlSetNsProp(cur, ns, BAD_CAST "space", BAD_CAST string);
    if (attr == NULL)
        return(-1);

    return(0);
}